

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  uint uVar1;
  size_t code;
  size_t initError;
  FSE_CState_t CState2;
  FSE_CState_t CState1;
  BIT_CStream_t bitC;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  uint fast_local;
  FSE_CTable *ct_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  if (srcSize < 3) {
    dst_local = (void *)0x0;
  }
  else {
    code = BIT_initCStream((BIT_CStream_t *)&CState1.stateLog,dst,dstSize);
    uVar1 = ERR_isError(code);
    if (uVar1 == 0) {
      if ((srcSize & 1) == 0) {
        FSE_initCState2((FSE_CState_t *)&initError,ct,(uint)*(byte *)((long)src + (srcSize - 1)));
        bitC.endPtr = (char *)((long)src + (srcSize - 2));
        FSE_initCState2((FSE_CState_t *)&CState2.stateLog,ct,
                        (uint)*(byte *)((long)src + (srcSize - 2)));
      }
      else {
        FSE_initCState2((FSE_CState_t *)&CState2.stateLog,ct,
                        (uint)*(byte *)((long)src + (srcSize - 1)));
        FSE_initCState2((FSE_CState_t *)&initError,ct,(uint)*(byte *)((long)src + (srcSize - 2)));
        bitC.endPtr = (char *)((long)src + (srcSize - 3));
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&CState2.stateLog,
                         (uint)*(byte *)((long)src + (srcSize - 3)));
        if (fast == 0) {
          BIT_flushBits((BIT_CStream_t *)&CState1.stateLog);
        }
        else {
          BIT_flushBitsFast((BIT_CStream_t *)&CState1.stateLog);
        }
      }
      if ((srcSize - 2 & 2) != 0) {
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&initError,
                         (uint)(byte)bitC.endPtr[-1]);
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&CState2.stateLog,
                         (uint)(byte)bitC.endPtr[-2]);
        if (fast == 0) {
          BIT_flushBits((BIT_CStream_t *)&CState1.stateLog);
          bitC.endPtr = bitC.endPtr + -2;
        }
        else {
          BIT_flushBitsFast((BIT_CStream_t *)&CState1.stateLog);
          bitC.endPtr = bitC.endPtr + -2;
        }
      }
      while (src < bitC.endPtr) {
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&initError,
                         (uint)(byte)bitC.endPtr[-1]);
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&CState2.stateLog,
                         (uint)(byte)bitC.endPtr[-2]);
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&initError,
                         (uint)(byte)bitC.endPtr[-3]);
        FSE_encodeSymbol((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&CState2.stateLog,
                         (uint)(byte)bitC.endPtr[-4]);
        if (fast == 0) {
          BIT_flushBits((BIT_CStream_t *)&CState1.stateLog);
          bitC.endPtr = bitC.endPtr + -4;
        }
        else {
          BIT_flushBitsFast((BIT_CStream_t *)&CState1.stateLog);
          bitC.endPtr = bitC.endPtr + -4;
        }
      }
      FSE_flushCState((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&initError);
      FSE_flushCState((BIT_CStream_t *)&CState1.stateLog,(FSE_CState_t *)&CState2.stateLog);
      dst_local = (void *)BIT_closeCStream((BIT_CStream_t *)&CState1.stateLog);
    }
    else {
      dst_local = (void *)0x0;
    }
  }
  return (size_t)dst_local;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}